

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QKmsPlane>::copyAppend
          (QGenericArrayOps<QKmsPlane> *this,QKmsPlane *b,QKmsPlane *e)

{
  QKmsPlane *pQVar1;
  Data *pDVar2;
  Type TVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  Rotations RVar15;
  Rotations RVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  long lVar19;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QKmsPlane>).ptr;
    lVar19 = (this->super_QArrayDataPointer<QKmsPlane>).size;
    do {
      pQVar1[lVar19].possibleCrtcs = b->possibleCrtcs;
      TVar3 = b->type;
      pQVar1[lVar19].id = b->id;
      pQVar1[lVar19].type = TVar3;
      pDVar2 = (b->supportedFormats).d.d;
      pQVar1[lVar19].supportedFormats.d.d = pDVar2;
      pQVar1[lVar19].supportedFormats.d.ptr = (b->supportedFormats).d.ptr;
      pQVar1[lVar19].supportedFormats.d.size = (b->supportedFormats).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      RVar15.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (b->initialRotation).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      RVar16.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (b->availableRotations).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      uVar17 = b->rotationPropertyId;
      uVar18 = b->crtcPropertyId;
      uVar11 = b->framebufferPropertyId;
      uVar12 = b->srcXPropertyId;
      uVar13 = b->srcYPropertyId;
      uVar14 = b->crtcXPropertyId;
      uVar7 = b->crtcYPropertyId;
      uVar8 = b->srcwidthPropertyId;
      uVar9 = b->srcheightPropertyId;
      uVar10 = b->crtcwidthPropertyId;
      uVar4 = b->zposPropertyId;
      uVar5 = b->blendOpPropertyId;
      uVar6 = b->activeCrtcId;
      pQVar1[lVar19].crtcheightPropertyId = b->crtcheightPropertyId;
      pQVar1[lVar19].zposPropertyId = uVar4;
      pQVar1[lVar19].blendOpPropertyId = uVar5;
      pQVar1[lVar19].activeCrtcId = uVar6;
      pQVar1[lVar19].crtcYPropertyId = uVar7;
      pQVar1[lVar19].srcwidthPropertyId = uVar8;
      pQVar1[lVar19].srcheightPropertyId = uVar9;
      pQVar1[lVar19].crtcwidthPropertyId = uVar10;
      pQVar1[lVar19].framebufferPropertyId = uVar11;
      pQVar1[lVar19].srcXPropertyId = uVar12;
      pQVar1[lVar19].srcYPropertyId = uVar13;
      pQVar1[lVar19].crtcXPropertyId = uVar14;
      pQVar1[lVar19].initialRotation =
           (Rotations)
           RVar15.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar1[lVar19].availableRotations =
           (Rotations)
           RVar16.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar1[lVar19].rotationPropertyId = uVar17;
      pQVar1[lVar19].crtcPropertyId = uVar18;
      b = b + 1;
      lVar19 = (this->super_QArrayDataPointer<QKmsPlane>).size + 1;
      (this->super_QArrayDataPointer<QKmsPlane>).size = lVar19;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }